

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O2

void __thiscall QLineEdit::setSelection(QLineEdit *this,int start,int length)

{
  long lVar1;
  QLineEditPrivate *this_00;
  QWidgetLineControl *pQVar2;
  int iVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QStyleOptionFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < start) {
    this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
    if (start <= (int)(this_00->control->m_text).d.size) {
      QWidgetLineControl::setSelection((QWidgetLineControl *)this_00->control,start,length);
      pQVar2 = this_00->control;
      if (((pQVar2->m_text).d.size != 0) && (pQVar2->m_selstart < pQVar2->m_selend)) {
        opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.rect.x1.m_i = -0x55555556;
        opt.super_QStyleOption.rect.y1.m_i = -0x55555556;
        opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        opt.super_QStyleOption.version = -0x55555556;
        opt.super_QStyleOption.type = -0x55555556;
        opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0xaaaaaaaa
        ;
        opt.super_QStyleOption.direction = 0xaaaaaaaa;
        QStyleOptionFrame::QStyleOptionFrame(&opt);
        (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&opt);
        pQVar4 = QWidget::style(&this->super_QWidget);
        iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x1c,&opt,this,0);
        if (iVar3 == 0) {
          QLineEditPrivate::setCursorVisible(this_00,false);
        }
        QStyleOption::~QStyleOption(&opt.super_QStyleOption);
      }
      goto LAB_003ebf4b;
    }
  }
  opt.super_QStyleOption.version = 2;
  opt.super_QStyleOption.rect.y1.m_i = 0;
  opt.super_QStyleOption.type = 0;
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  opt.super_QStyleOption.direction = LeftToRight;
  opt.super_QStyleOption.rect.x1.m_i = 0;
  opt.super_QStyleOption.rect._8_8_ = anon_var_dwarf_66827;
  QMessageLogger::warning((char *)&opt,"QLineEdit::setSelection: Invalid start position (%d)",start)
  ;
LAB_003ebf4b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::setSelection(int start, int length)
{
    Q_D(QLineEdit);
    if (Q_UNLIKELY(start < 0 || start > (int)d->control->end())) {
        qWarning("QLineEdit::setSelection: Invalid start position (%d)", start);
        return;
    }

    d->control->setSelection(start, length);

    if (d->control->hasSelectedText()){
        QStyleOptionFrame opt;
        initStyleOption(&opt);
        if (!style()->styleHint(QStyle::SH_BlinkCursorWhenTextSelected, &opt, this))
            d->setCursorVisible(false);
    }
}